

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O1

void __thiscall
icu_63::KhmerBreakEngine::KhmerBreakEngine
          (KhmerBreakEngine *this,DictionaryMatcher *adoptDictionary,UErrorCode *status)

{
  UnicodeSet *this_00;
  UnicodeSet *this_01;
  UnicodeSet *this_02;
  UnicodeSet *this_03;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__KhmerBreakEngine_0024c050;
  this_00 = &this->fKhmerWordSet;
  UnicodeSet::UnicodeSet(this_00);
  this_01 = &this->fEndWordSet;
  UnicodeSet::UnicodeSet(this_01);
  this_02 = &this->fBeginWordSet;
  UnicodeSet::UnicodeSet(this_02);
  this_03 = &this->fMarkSet;
  UnicodeSet::UnicodeSet(this_03);
  this->fDictionary = adoptDictionary;
  local_98.p_ = L"[[:Khmr:]&[:LineBreak=SA:]]";
  UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
  UnicodeSet::applyPattern(this_00,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  local_80 = local_98.p_;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
              (this,this_00);
  }
  local_a0.p_ = L"[[:Khmr:]&[:LineBreak=SA:]&[:M:]]";
  UnicodeString::UnicodeString(&local_70,'\x01',&local_a0,-1);
  UnicodeSet::applyPattern(this_03,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  local_90 = local_a0.p_;
  UnicodeSet::add(this_03,0x20);
  UnicodeSet::operator=(this_01,this_00);
  UnicodeSet::add(this_02,0x1780,0x17b3);
  UnicodeSet::remove(this_01,(char *)0x17d2);
  UnicodeSet::compact(this_03);
  UnicodeSet::compact(this_01);
  UnicodeSet::compact(this_02);
  return;
}

Assistant:

KhmerBreakEngine::KhmerBreakEngine(DictionaryMatcher *adoptDictionary, UErrorCode &status)
    : DictionaryBreakEngine(),
      fDictionary(adoptDictionary)
{
    fKhmerWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Khmr:]&[:LineBreak=SA:]]"), status);
    if (U_SUCCESS(status)) {
        setCharacters(fKhmerWordSet);
    }
    fMarkSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Khmr:]&[:LineBreak=SA:]&[:M:]]"), status);
    fMarkSet.add(0x0020);
    fEndWordSet = fKhmerWordSet;
    fBeginWordSet.add(0x1780, 0x17B3);
    //fBeginWordSet.add(0x17A3, 0x17A4);      // deprecated vowels
    //fEndWordSet.remove(0x17A5, 0x17A9);     // Khmer independent vowels that can't end a word
    //fEndWordSet.remove(0x17B2);             // Khmer independent vowel that can't end a word
    fEndWordSet.remove(0x17D2);             // KHMER SIGN COENG that combines some following characters
    //fEndWordSet.remove(0x17B6, 0x17C5);     // Remove dependent vowels
//    fEndWordSet.remove(0x0E31);             // MAI HAN-AKAT
//    fEndWordSet.remove(0x0E40, 0x0E44);     // SARA E through SARA AI MAIMALAI
//    fBeginWordSet.add(0x0E01, 0x0E2E);      // KO KAI through HO NOKHUK
//    fBeginWordSet.add(0x0E40, 0x0E44);      // SARA E through SARA AI MAIMALAI
//    fSuffixSet.add(THAI_PAIYANNOI);
//    fSuffixSet.add(THAI_MAIYAMOK);

    // Compact for caching.
    fMarkSet.compact();
    fEndWordSet.compact();
    fBeginWordSet.compact();
//    fSuffixSet.compact();
}